

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

SharedPtr<const_vkt::shaderexecutor::Expr<int>_> * __thiscall
de::SharedPtr<const_vkt::shaderexecutor::Expr<int>_>::operator=
          (SharedPtr<const_vkt::shaderexecutor::Expr<int>_> *this,
          SharedPtr<const_vkt::shaderexecutor::Expr<int>_> *other)

{
  SharedPtr<const_vkt::shaderexecutor::Expr<int>_> *other_local;
  SharedPtr<const_vkt::shaderexecutor::Expr<int>_> *this_local;
  
  if (this->m_state != other->m_state) {
    release(this);
    this->m_ptr = other->m_ptr;
    this->m_state = other->m_state;
    acquire(this);
  }
  return this;
}

Assistant:

inline SharedPtr<T>& SharedPtr<T>::operator= (const SharedPtr<T>& other)
{
	if (m_state == other.m_state)
		return *this;

	// Release current reference.
	release();

	// Copy from other and acquire reference.
	m_ptr	= other.m_ptr;
	m_state	= other.m_state;

	acquire();

	return *this;
}